

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

void __thiscall Date::add_month(Date *this,uint32_t n)

{
  bool bVar1;
  Month MVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint year;
  long lVar7;
  double dVar8;
  
  dVar8 = floor((double)n / 12.0);
  lVar3 = this->days;
  if (0 < (int)dVar8) {
    lVar3 = lVar3 + (ulong)(uint)(int)dVar8 * 0x16d;
    this->days = lVar3;
  }
  uVar5 = n % 0xc;
  uVar4 = 0x7b2;
  uVar6 = 0x7b1;
  do {
    year = uVar6 + 1;
    lVar7 = 0x16d;
    if ((year & 3) == 0) {
      lVar7 = (ulong)((int)(uVar4 / 400) * -400 + 0x7b2 + uVar6 == 0x7b1 ||
                     (int)(uVar4 / 100) * -100 + 0x7b2 + uVar6 != 0x7b1) + 0x16d;
    }
    uVar4 = (ulong)((int)uVar4 + 1);
    bVar1 = lVar7 <= lVar3;
    lVar3 = lVar3 - lVar7;
    uVar6 = year;
  } while (bVar1);
  days_in_months(year);
  for (; uVar5 != 0; uVar5 = uVar5 - 1) {
    MVar2 = month(this);
    this->days = this->days + (long)*(int *)(&DAT_0011f6ec + (ulong)MVar2 * 4);
  }
  return;
}

Assistant:

void Date::add_month(uint32_t n)
{
	auto years_to_add = int(std::floor(n / 12.0));
	auto months_to_add = n % 12;
	if (years_to_add > 0)
		add_year(years_to_add);
	auto months = days_in_months(year());
	while (months_to_add > 0)
	{
		days += months[int(month()) - 1];
		--months_to_add;
	}
}